

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

void SendMessageAck(MQTT_CLIENT *mqtt_client,uint16_t packetId,QOS_VALUE qosValue)

{
  int iVar1;
  BUFFER_HANDLE handle;
  LOGGER_LOG p_Var2;
  size_t length;
  uchar *data;
  STRING_HANDLE trace_log;
  char *pcVar3;
  
  if (qosValue == DELIVER_EXACTLY_ONCE) {
    handle = mqtt_codec_publishReceived(packetId);
    if (handle != (BUFFER_HANDLE)0x0) {
LAB_00113ac4:
      length = BUFFER_length(handle);
      data = BUFFER_u_char(handle);
      iVar1 = sendPacketItem(mqtt_client,data,length);
      if (iVar1 == 0) {
        if ((mqtt_client->mqtt_flags & 1) != 0) {
          pcVar3 = "PUBACK";
          if (qosValue == DELIVER_EXACTLY_ONCE) {
            pcVar3 = "PUBREC";
          }
          trace_log = STRING_construct_sprintf("%s | PACKET_ID: %u",pcVar3,(ulong)packetId);
          log_outgoing_trace((MQTT_CLIENT *)(ulong)mqtt_client->mqtt_flags,trace_log);
          STRING_delete(trace_log);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                    ,"SendMessageAck",0x2a0,1,"Failed sending publish reply.");
        }
        if (mqtt_client->fnOnErrorCallBack != (ON_MQTT_ERROR_CALLBACK)0x0) {
          (*mqtt_client->fnOnErrorCallBack)
                    (mqtt_client,MQTT_CLIENT_COMMUNICATION_ERROR,mqtt_client->errorCBCtx);
        }
        close_connection(mqtt_client);
      }
      BUFFER_delete(handle);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113bd8;
    pcVar3 = "Failed to allocate publish receive message.";
    iVar1 = 0x289;
  }
  else {
    if (qosValue != DELIVER_AT_LEAST_ONCE) {
      return;
    }
    handle = mqtt_codec_publishAck(packetId);
    if (handle != (BUFFER_HANDLE)0x0) goto LAB_00113ac4;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113bd8;
    pcVar3 = "Failed to allocate publish ack message.";
    iVar1 = 0x294;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
            ,"SendMessageAck",iVar1,1,pcVar3);
LAB_00113bd8:
  if (mqtt_client->fnOnErrorCallBack != (ON_MQTT_ERROR_CALLBACK)0x0) {
    (*mqtt_client->fnOnErrorCallBack)(mqtt_client,MQTT_CLIENT_MEMORY_ERROR,mqtt_client->errorCBCtx);
  }
  close_connection(mqtt_client);
  return;
}

Assistant:

static void SendMessageAck(MQTT_CLIENT* mqtt_client, uint16_t packetId, QOS_VALUE qosValue)
{
    CONTROL_PACKET_TYPE response_packet_type = UNKNOWN_TYPE;
    BUFFER_HANDLE pubRel = NULL;
    if (qosValue == DELIVER_EXACTLY_ONCE)
    {
        pubRel = mqtt_codec_publishReceived(packetId);
        if (pubRel == NULL)
        {
            LogError("Failed to allocate publish receive message.");
            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
        }

        response_packet_type = PUBREC_TYPE;
    }
    else if (qosValue == DELIVER_AT_LEAST_ONCE)
    {
        pubRel = mqtt_codec_publishAck(packetId);
        if (pubRel == NULL)
        {
            LogError("Failed to allocate publish ack message.");
            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
        }

        response_packet_type = PUBACK_TYPE;
    }

    if (pubRel != NULL)
    {
        size_t size = BUFFER_length(pubRel);
        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
        {
            LogError("Failed sending publish reply.");
            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
        }
#ifndef NO_LOGGING
        else if (is_trace_enabled(mqtt_client))
        {
            STRING_HANDLE ack_trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, 
                response_packet_type == PUBACK_TYPE ? "PUBACK" : ((response_packet_type == PUBREC_TYPE) ? "PUBREC" : "UNDEFINED"),
                packetId);

            log_outgoing_trace(mqtt_client, ack_trace_log);
            STRING_delete(ack_trace_log);
        }
#endif
        BUFFER_delete(pubRel);
    }
}